

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O0

void __thiscall xsettingsd::SettingsManager::~SettingsManager(SettingsManager *this)

{
  bool bVar1;
  SettingsManager *this_local;
  
  if (this->display_ != (Display *)0x0) {
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->windows_);
    if (!bVar1) {
      DestroyWindows(this);
    }
    XCloseDisplay(this->display_);
    this->display_ = (Display *)0x0;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->windows_);
  SettingsMap::~SettingsMap(&this->settings_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SettingsManager::~SettingsManager() {
  if (display_) {
    if (!windows_.empty())
      DestroyWindows();
    XCloseDisplay(display_);
    display_ = NULL;
  }
}